

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O3

void __thiscall tst_helpers_each::functorThrows(tst_helpers_each *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QArrayData *pQVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> this_00;
  bool bVar4;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<QList<int>_> *pPVar5;
  QPromiseReject<QList<int>_> *reject;
  QByteArrayView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  PromiseResolver<QList<int>_> resolver_1;
  QArrayData *local_148;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> QStack_140;
  undefined **local_138;
  PromiseData<QList<int>_> *local_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_128;
  QPromise<QList<int>_> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_110;
  QString local_108;
  function<void_()> local_e8;
  QSharedData *local_c8;
  QPromiseBase<QList<int>_> local_c0;
  QString local_b0;
  PromiseResolver<void> resolver;
  _Manager_type local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_b0.d.ptr = (char16_t *)QArrayData::allocate((QArrayData **)&local_b0,4,8,3,KeepSize);
  *(undefined1 **)local_b0.d.ptr = &DAT_2b0000002a;
  local_b0.d.ptr[4] = L',';
  local_b0.d.ptr[5] = L'\0';
  local_b0.d.size = 3;
  QtPromise::QPromiseBase<QList<int>_>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:255:24),_0>
            (&local_c0,(QList<int> *)&local_b0);
  this_00.d = local_c0.m_d.d;
  local_c0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001444c8;
  if (local_c0.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_c0.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001446e8;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00144680;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c8 = &this_01->super_QSharedData;
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00144618;
  local_e8.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e8);
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00144660;
  if ((PromiseDataBase<void,_void_()> *)local_e8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_e8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_e8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_e8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  if (resolver.m_d.d == (Data *)0x0) {
    local_108.d.d = (Data *)0x0;
    QStack_140.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_108.d.d = (Data *)resolver.m_d.d;
    if (resolver.m_d.d == (Data *)0x0) {
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (Data *)0x0;
LAB_0010a3b3:
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      QStack_140 = resolver_1.m_d.d;
      if (resolver_1.m_d.d == (Data *)0x0) goto LAB_0010a3c8;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) goto LAB_0010a3b3;
    }
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    QStack_140 = resolver_1.m_d.d;
  }
LAB_0010a3c8:
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       QStack_140.d;
  local_148 = &(local_108.d.d)->super_QArrayData;
  local_78._M_unused._M_object = operator_new(0x18);
  *(QArrayData **)local_78._M_unused._0_8_ = local_148;
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 8) = QStack_140.d;
  if (QStack_140.d == (Data *)0x0) {
    *(code *)((long)local_78._M_unused._0_8_ + 0x10) = local_138._0_1_;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(code *)((long)local_78._M_unused._0_8_ + 0x10) = local_138._0_1_;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if (QStack_140.d != (Data *)0x0) {
      LOCK();
      ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_140.d,0x10);
      }
    }
  }
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_148,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QList<int>_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_108,
             (QPromiseResolve<void> *)&resolver_1,(QPromiseReject<void> *)reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&((local_108.d.d)->super_QArrayData).ref_._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&((local_108.d.d)->super_QArrayData).ref_._q_value)->
         super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>
         ._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)&((local_108.d.d)->super_QArrayData).ref_._q_value)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_108.d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  LOCK();
  pQVar1 = &((this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = &((this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00144498;
  pPVar5 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00144578;
  QReadWriteLock::QReadWriteLock
            (&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00144500;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108.d.d = (Data *)&PTR__QPromiseBase_001444c8;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar5;
  local_108.d.ptr = (char16_t *)pPVar5;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&local_108);
  local_108.d.d = (Data *)&PTR__QPromiseBase_00144498;
  if ((PromiseData<QList<int>_> *)local_108.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_108.d.ptr)->
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_108.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_108.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_110.d = (Data *)0x0;
    local_128.d = (Data *)0x0;
    goto LAB_0010a6f3;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  local_110 = resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_128.d = (Data *)0x0;
LAB_0010a6de:
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (local_128.d == (Data *)0x0) goto LAB_0010a6f3;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_128 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_0010a6de;
  }
  LOCK();
  ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_0010a6f3:
  local_130 = this_00.d;
  LOCK();
  pQVar2 = &((this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_138 = &PTR__QPromiseBase_001444c8;
  local_e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_e8._M_invoker = (_Invoker_type)0x0;
  local_148 = (QArrayData *)local_110.d;
  QStack_140.d = local_128.d;
  local_e8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(QArrayData **)local_e8.super__Function_base._M_functor._M_unused._0_8_ = local_148;
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 8) = QStack_140.d;
  if (QStack_140.d != (Data *)0x0) {
    LOCK();
    ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00144498;
  *(PromiseData<QList<int>_> **)
   ((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_130;
  if (local_130 == (PromiseData<QList<int>_> *)0x0) {
    *(undefined ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &PTR__QPromiseBase_001444c8;
    local_e8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_e8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_138 = &PTR__QPromiseBase_00144498;
  }
  else {
    LOCK();
    pQVar2 = &(local_130->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &PTR__QPromiseBase_001444c8;
    local_e8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_e8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_138 = &PTR__QPromiseBase_00144498;
    if (local_130 != (PromiseData<QList<int>_> *)0x0) {
      LOCK();
      pQVar2 = &(local_130->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_130 != (PromiseData<QList<int>_> *)0x0)) {
        (*(local_130->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
  }
  if (QStack_140.d != (Data *)0x0) {
    LOCK();
    ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_140.d,0x10);
    }
  }
  if (local_148 != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)&(local_148->ref_)._q_value)->super_QAtomicInteger<int>).
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_148,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler(this_01,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_110,
             (QPromiseResolve<QList<int>_> *)&local_128,reject);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_128.d,0x10);
    }
  }
  if ((QArrayData *)local_110.d != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&((QBasicAtomicInt *)&(local_110.d)->super_QSharedData)->_q_value)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)&((QBasicAtomicInt *)&(local_110.d)->super_QSharedData)->_q_value)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)&((QBasicAtomicInt *)&(local_110.d)->super_QSharedData)->_q_value)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001444c8;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
      _vptr_PromiseDataBase[1])(this_00.d);
  }
  LOCK();
  (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
      _vptr_PromiseDataBase[1])(this_00.d);
  }
  local_c0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00144498;
  if (local_c0.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_c0.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_c0.m_d.d != (PromiseData<QList<int>_> *)0x0))
    {
      (*((local_c0.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,4,8);
    }
  }
  local_108.d.d = (Data *)0x0;
  local_108.d.ptr = (char16_t *)0x0;
  local_108.d.size = 0;
  waitForError<QList<int>,QString>(&local_b0,&p,&local_108);
  QVar6.m_data = (storage_type *)0x3;
  QVar6.m_size = (qsizetype)&local_148;
  QString::fromUtf8(QVar6);
  pQVar3 = local_148;
  QVar7.m_data = local_b0.d.ptr;
  QVar7.m_size = local_b0.d.size;
  QVar8.m_data = (storage_type_conflict *)QStack_140.d;
  QVar8.m_size = (qsizetype)local_138;
  QTest::qCompare(QVar7,QVar8,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                  ,0x85);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,8);
    }
  }
  if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00144498;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_each::functorArguments()
{
    QVector<int> values;
    auto p = QtPromise::each(QVector<int>{42, 43, 44}, [&](int v, int i) {
        values << i << v;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(values, (QVector<int>{0, 42, 1, 43, 2, 44}));
}